

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O0

ListenerImpl * __thiscall
PoolList<Server::Private::ListenerImpl>::allocateFreeItem
          (PoolList<Server::Private::ListenerImpl> *this)

{
  ItemBlock *pIVar1;
  Item *end;
  Item *i;
  ItemBlock *itemBlock;
  Item *item;
  PoolList<Server::Private::ListenerImpl> *this_local;
  
  itemBlock = (ItemBlock *)this->freeItem;
  if ((Item *)itemBlock == (Item *)0x0) {
    pIVar1 = (ItemBlock *)operator_new__(0x88);
    pIVar1->next = this->blocks;
    this->blocks = pIVar1;
    for (end = (Item *)(pIVar1 + 1); end < (Item *)(pIVar1 + 0x11); end = end + 2) {
      end->prev = (Item *)itemBlock;
      itemBlock = (ItemBlock *)end;
    }
    this->freeItem = (Item *)itemBlock;
  }
  return (ListenerImpl *)(itemBlock + 2);
}

Assistant:

T* allocateFreeItem()
  {
    Item* item = freeItem;
    if(!item)
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + (sizeof(Item) + sizeof(T)) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      for(Item* i = (Item*)(itemBlock + 1), * end = (Item*)((char*)i + 4 * (sizeof(Item) + sizeof(T)));
        i < end; 
        i = (Item*)((char*)i + (sizeof(Item) + sizeof(T))))
      {
        i->prev = item;
        item = i;
      }
      freeItem = item;
    }
    return (T*)(item + 1);
  }